

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.hh
# Opt level: O0

void __thiscall
tchecker::
index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::add(index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this,uint *k,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t)

{
  size_type sVar1;
  size_type sVar2;
  invalid_argument *piVar3;
  stored_size_type *psVar4;
  undefined1 local_d0 [56];
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  local_98;
  bool *ok2;
  type_conflict1 *ok;
  type *it;
  pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  flat_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_void>
  local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_local;
  uint *k_local;
  index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_20 = t;
  t_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)k;
  k_local = (uint *)this;
  sVar1 = boost::container::
          flat_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_void>
          ::size(&this->_key_map);
  sVar2 = boost::container::
          flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
          ::size(&this->_value_map);
  if (sVar1 != sVar2) {
    __assert_fail("_key_map.size() == _value_map.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/index.hh"
                  ,0x58,
                  "void tchecker::index_t<unsigned int, std::basic_string<char>>::add(const KEY &, const T &) [KEY = unsigned int, T = std::basic_string<char>]"
                 );
  }
  std::
  pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_60,(uint *)t_local,local_20);
  boost::container::
  flat_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_void>
  ::insert(&local_38,(value_type *)this);
  std::
  pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_60);
  local_38.m_flat_tree.m_data.m_seq.m_holder.m_capacity = (stored_size_type)&local_38;
  ok = (type_conflict1 *)
       std::
       get<0ul,boost::container::vec_iterator<std::pair<unsigned_int,std::__cxx11::string>*,false>,bool>
                 ((pair<boost::container::vec_iterator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>,_bool>
                   *)local_38.m_flat_tree.m_data.m_seq.m_holder.m_capacity);
  ok2 = std::
        get<1ul,boost::container::vec_iterator<std::pair<unsigned_int,std::__cxx11::string>*,false>,bool>
                  ((pair<boost::container::vec_iterator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>,_bool>
                    *)local_38.m_flat_tree.m_data.m_seq.m_holder.m_capacity);
  if ((*ok2 & 1U) == 0) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"key is already indexed");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)(local_d0 + 0x10),local_20,(uint *)t_local);
  boost::container::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  ::insert(&local_98,(value_type *)&this->_value_map);
  psVar4 = &local_98.m_flat_tree.m_data.m_seq.m_holder.m_size;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
           *)(local_d0 + 0x10));
  local_98.m_flat_tree.m_data.m_seq.m_holder.m_capacity = (stored_size_type)psVar4;
  if (((byte)local_98.m_flat_tree.m_data.m_seq.m_holder.m_size & 1) != 0) {
    sVar1 = boost::container::
            flat_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_void>
            ::size(&this->_key_map);
    sVar2 = boost::container::
            flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
            ::size(&this->_value_map);
    if (sVar1 == sVar2) {
      return;
    }
    __assert_fail("_key_map.size() == _value_map.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/index.hh"
                  ,0x65,
                  "void tchecker::index_t<unsigned int, std::basic_string<char>>::add(const KEY &, const T &) [KEY = unsigned int, T = std::basic_string<char>]"
                 );
  }
  boost::container::
  vec_iterator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  ::vec_iterator((vec_iterator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
                  *)(local_d0 + 8),(nonconst_iterator *)ok);
  boost::container::
  flat_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_void>
  ::erase((flat_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_void>
           *)local_d0,(const_iterator *)this);
  sVar1 = boost::container::
          flat_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_void>
          ::size(&this->_key_map);
  sVar2 = boost::container::
          flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
          ::size(&this->_value_map);
  if (sVar1 == sVar2) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"value is already indexed");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  __assert_fail("_key_map.size() == _value_map.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/index.hh"
                ,0x61,
                "void tchecker::index_t<unsigned int, std::basic_string<char>>::add(const KEY &, const T &) [KEY = unsigned int, T = std::basic_string<char>]"
               );
}

Assistant:

void add(KEY const & k, T const & t)
  {
    assert(_key_map.size() == _value_map.size());

    auto && [it, ok] = _key_map.insert(typename key_map_t::value_type(k, t));
    if (!ok)
      throw std::invalid_argument("key is already indexed");

    auto && ok2 = _value_map.insert(typename value_map_t::value_type(t, k)).second;
    if (!ok2) {
      _key_map.erase(it);
      assert(_key_map.size() == _value_map.size());
      throw std::invalid_argument("value is already indexed");
    }

    assert(_key_map.size() == _value_map.size());
  }